

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O0

PyObject * libxml_saveNodeTo(PyObject *self,PyObject *args)

{
  int iVar1;
  undefined8 uVar2;
  FILE *local_78;
  xmlDocPtr local_70;
  long local_68;
  xmlCharEncodingHandlerPtr handler;
  xmlOutputBufferPtr buf;
  int len;
  int format;
  char *encoding;
  xmlDocPtr doc;
  xmlNodePtr node;
  PyObject *pyobj_node;
  FILE *output;
  PyObject *py_file;
  PyObject *args_local;
  PyObject *self_local;
  
  output = (FILE *)0x0;
  local_68 = 0;
  py_file = args;
  args_local = self;
  iVar1 = _PyArg_ParseTuple_SizeT(args,"OOzi:serializeNode",&node,&output,&len,(long)&buf + 4);
  if (iVar1 == 0) {
    self_local = (PyObject *)0x0;
  }
  else {
    if (node == (xmlNodePtr)&_Py_NoneStruct) {
      local_70 = (xmlDocPtr)0x0;
    }
    else {
      local_70 = (xmlDocPtr)node->name;
    }
    doc = local_70;
    if (local_70 == (xmlDocPtr)0x0) {
      self_local = (PyObject *)PyLong_FromLong(0xffffffffffffffff);
    }
    else {
      if (output == (FILE *)&_Py_NoneStruct) {
        local_78 = (FILE *)0x0;
      }
      else {
        local_78 = libxml_PyFileGet((PyObject *)output);
      }
      pyobj_node = (PyObject *)local_78;
      if (local_78 == (FILE *)0x0) {
        self_local = (PyObject *)PyLong_FromLong(0xffffffffffffffff);
      }
      else {
        if (doc->type == XML_DOCUMENT_NODE) {
          encoding = (char *)doc;
        }
        else if (doc->type == XML_HTML_DOCUMENT_NODE) {
          encoding = (char *)doc;
        }
        else {
          encoding = (char *)doc->doc;
        }
        if ((*(int *)(encoding + 8) == 0xd) && (_len == 0)) {
          _len = htmlGetMetaEncoding(encoding);
        }
        if ((_len == 0) || (local_68 = xmlFindCharEncodingHandler(_len), local_68 != 0)) {
          if (*(int *)(encoding + 8) == 0xd) {
            if (local_68 == 0) {
              local_68 = xmlFindCharEncodingHandler("HTML");
            }
            if (local_68 == 0) {
              local_68 = xmlFindCharEncodingHandler("ascii");
            }
          }
          uVar2 = xmlOutputBufferCreateFile(pyobj_node,local_68);
          if (doc->type == XML_DOCUMENT_NODE) {
            buf._0_4_ = xmlSaveFormatFileTo(uVar2,encoding,_len,buf._4_4_);
          }
          else if (doc->type == XML_HTML_DOCUMENT_NODE) {
            htmlDocContentDumpFormatOutput(uVar2,encoding,_len,buf._4_4_);
            buf._0_4_ = xmlOutputBufferClose(uVar2);
          }
          else if (*(int *)(encoding + 8) == 0xd) {
            htmlNodeDumpFormatOutput(uVar2,encoding,doc,_len,buf._4_4_);
            buf._0_4_ = xmlOutputBufferClose(uVar2);
          }
          else {
            xmlNodeDumpOutput(uVar2,encoding,doc,0,buf._4_4_,_len);
            buf._0_4_ = xmlOutputBufferClose(uVar2);
          }
          libxml_PyFileRelease((FILE *)pyobj_node);
          self_local = (PyObject *)PyLong_FromLong((long)(int)buf);
        }
        else {
          libxml_PyFileRelease((FILE *)pyobj_node);
          self_local = (PyObject *)PyLong_FromLong(0xffffffffffffffff);
        }
      }
    }
  }
  return self_local;
}

Assistant:

static PyObject *
libxml_saveNodeTo(ATTRIBUTE_UNUSED PyObject * self, PyObject * args)
{
    PyObject *py_file = NULL;
    FILE *output;
    PyObject *pyobj_node;
    xmlNodePtr node;
    xmlDocPtr doc;
    const char *encoding;
    int format;
    int len;
    xmlOutputBufferPtr buf;
    xmlCharEncodingHandlerPtr handler = NULL;

    if (!PyArg_ParseTuple(args, (char *) "OOzi:serializeNode", &pyobj_node,
                          &py_file, &encoding, &format))
        return (NULL);
    node = (xmlNodePtr) PyxmlNode_Get(pyobj_node);
    if (node == NULL) {
        return (PyLong_FromLong((long) -1));
    }
    output = PyFile_Get(py_file);
    if (output == NULL) {
        return (PyLong_FromLong((long) -1));
    }

    if (node->type == XML_DOCUMENT_NODE) {
        doc = (xmlDocPtr) node;
    } else if (node->type == XML_HTML_DOCUMENT_NODE) {
        doc = (xmlDocPtr) node;
    } else {
        doc = node->doc;
    }
#ifdef LIBXML_HTML_ENABLED
    if (doc->type == XML_HTML_DOCUMENT_NODE) {
        if (encoding == NULL)
            encoding = (const char *) htmlGetMetaEncoding(doc);
    }
#endif /* LIBXML_HTML_ENABLED */
    if (encoding != NULL) {
        handler = xmlFindCharEncodingHandler(encoding);
        if (handler == NULL) {
            PyFile_Release(output);
            return (PyLong_FromLong((long) -1));
        }
    }
    if (doc->type == XML_HTML_DOCUMENT_NODE) {
        if (handler == NULL)
            handler = xmlFindCharEncodingHandler("HTML");
        if (handler == NULL)
            handler = xmlFindCharEncodingHandler("ascii");
    }

    buf = xmlOutputBufferCreateFile(output, handler);
    if (node->type == XML_DOCUMENT_NODE) {
        len = xmlSaveFormatFileTo(buf, doc, encoding, format);
#ifdef LIBXML_HTML_ENABLED
    } else if (node->type == XML_HTML_DOCUMENT_NODE) {
        htmlDocContentDumpFormatOutput(buf, doc, encoding, format);
        len = xmlOutputBufferClose(buf);
    } else if (doc->type == XML_HTML_DOCUMENT_NODE) {
        htmlNodeDumpFormatOutput(buf, doc, node, encoding, format);
        len = xmlOutputBufferClose(buf);
#endif /* LIBXML_HTML_ENABLED */
    } else {
        xmlNodeDumpOutput(buf, doc, node, 0, format, encoding);
        len = xmlOutputBufferClose(buf);
    }
    PyFile_Release(output);
    return (PyLong_FromLong((long) len));
}